

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::adaptive_huffman_data_model::reset(adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uint local_14;
  uint i;
  adaptive_huffman_data_model *this_local;
  
  if (this->m_total_syms != 0) {
    for (local_14 = 0; local_14 < this->m_total_syms; local_14 = local_14 + 1) {
      puVar1 = vector<unsigned_short>::operator[](&this->m_sym_freq,local_14);
      *puVar1 = 1;
    }
    this->m_total_count = 0;
    this->m_update_cycle = this->m_total_syms;
    update(this);
    this->m_update_cycle = 8;
    this->m_symbols_until_update = 8;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::reset() {
  if (!m_total_syms)
    return;

  for (uint i = 0; i < m_total_syms; i++)
    m_sym_freq[i] = 1;

  m_total_count = 0;
  m_update_cycle = m_total_syms;

  update();

  m_symbols_until_update = m_update_cycle = 8;  //(m_total_syms + 6) >> 1;
}